

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator local_e1;
  seconds another_ten_years;
  years half_year;
  undefined1 local_d0 [40];
  long lStack_a8;
  char *local_a0;
  duration<31536000UL> one_year_and_quarter;
  years ten_years;
  string local_88;
  datetime ten_years_from_now;
  
  setlocale(6,"");
  ten_years.value = 10.0;
  half_year.value = 0.5;
  one_year_and_quarter.value = 1.2465753424657535;
  asap::now();
  ten_years_from_now.when.tm_zone = local_a0;
  ten_years_from_now.when._32_8_ = local_d0._32_8_;
  ten_years_from_now.when.tm_gmtoff = lStack_a8;
  ten_years_from_now.when.tm_mon = local_d0._16_4_;
  ten_years_from_now.when.tm_year = local_d0._20_4_;
  ten_years_from_now.when.tm_wday = local_d0._24_4_;
  ten_years_from_now.when.tm_yday = local_d0._28_4_;
  ten_years_from_now.when.tm_sec = local_d0._0_4_;
  ten_years_from_now.when.tm_min = local_d0._4_4_;
  ten_years_from_now.when.tm_hour = local_d0._8_4_;
  ten_years_from_now.when.tm_mday = local_d0._12_4_;
  asap::datetime::operator+=(&ten_years_from_now,&ten_years);
  asap::now();
  another_ten_years = asap::datetime::operator-(&ten_years_from_now,(datetime *)local_d0);
  poVar1 = std::operator<<((ostream *)&std::cout,"ten_years            ->   ");
  asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,&ten_years);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"one_year_and_quarter ->   ");
  asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,&one_year_and_quarter);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"ten_years_from_now   ->   ");
  std::__cxx11::string::string((string *)&local_88,"%x %X",&local_e1);
  asap::datetime::str((string *)local_d0,&ten_years_from_now,&local_88);
  std::operator<<(poVar1,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&local_88);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"another_ten_years    ->   ");
  asap::duration<1ul>::str_abi_cxx11_((string *)local_d0,&another_ten_years);
  std::operator<<(poVar1,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"half_year            ->   ");
  asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,&half_year);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  /* Setting locale helps with local time format. It is not required. */
  setlocale(LC_ALL, "");

  /* duration types represent durations in various granularities, from seconds to days. */
  auto ten_years = asap::years(10);

  /* you can specify a fraction of a duration: */
  auto half_year = asap::years(0.5f);

  /* you can sum and subtract durations. be aware that the right operand will be converted to the first operand
   * granularity (i.e, when adding years + days, days will be converted to a fraction of a year) */
  auto one_year_and_quarter = asap::years(1) + asap::months(3);

  /* you can add or subtract a duration from a datetime */
  auto ten_years_from_now = asap::now() + ten_years;

  /* subtracting two datetimes yields a duration, in seconds */
  auto another_ten_years = ten_years_from_now - asap::now();

  std::cout << "ten_years            ->   " << ten_years << std::endl;
  std::cout << "one_year_and_quarter ->   " << one_year_and_quarter << std::endl;
  std::cout << "ten_years_from_now   ->   " << ten_years_from_now << std::endl;
  std::cout << "another_ten_years    ->   " << another_ten_years << std::endl;

  /* be aware that for printing and arithmethics, a month has 30 days, thus half an year
   * is actually 6 months, 2 days and 12 hours. asap::years(0.5) != asap::months(6) */
  std::cout << "half_year            ->   " << half_year << std::endl;

  return 0;
}